

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenRefEq(BinaryenModuleRef module,BinaryenExpressionRef left,BinaryenExpressionRef right)

{
  RefEq *pRVar1;
  Builder local_28;
  Expression *local_20;
  BinaryenExpressionRef right_local;
  BinaryenExpressionRef left_local;
  BinaryenModuleRef module_local;
  
  local_20 = right;
  right_local = left;
  left_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(&local_28,module);
  pRVar1 = wasm::Builder::makeRefEq(&local_28,right_local,local_20);
  return (BinaryenExpressionRef)pRVar1;
}

Assistant:

BinaryenExpressionRef BinaryenRefEq(BinaryenModuleRef module,
                                    BinaryenExpressionRef left,
                                    BinaryenExpressionRef right) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeRefEq((Expression*)left, (Expression*)right));
}